

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

art_ref_t art_move_node_to_shrink(art_t *art,art_ref_t ref)

{
  ulong uVar1;
  long lVar2;
  size_t __n;
  int iVar3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  art_typecode_t typecode;
  ulong uVar10;
  
  uVar8 = ref >> 0x10;
  uVar9 = ref & 0xff;
  uVar1 = art->first_free[uVar9];
  if (uVar1 <= uVar8) {
    cVar4 = (char)ref;
    iVar3 = (int)uVar9;
    if ((byte)(cVar4 - 1U) < 5) {
      uVar10 = *(ulong *)(*(long *)((long)art->nodes + (ulong)(uint)(iVar3 * 8)) +
                         (uVar1 & 0xffffffffffff) *
                         *(long *)((long)ART_NODE_SIZES + (ulong)(uint)(iVar3 * 8)));
    }
    else {
      uVar10 = 0;
    }
    lVar2 = *(long *)((long)art->nodes + (ulong)(uint)(iVar3 * 8));
    __n = *(size_t *)((long)ART_NODE_SIZES + (ulong)(uint)(iVar3 * 8));
    memcpy((void *)((uVar1 & 0xffffffffffff) * __n + lVar2),(void *)(__n * uVar8 + lVar2),__n);
    uVar5 = uVar10;
    uVar6 = uVar10;
    if (uVar10 < uVar8) {
      do {
        uVar5 = uVar6;
        if ((byte)(cVar4 - 1U) < 5) {
          uVar6 = *(ulong *)(*(long *)((long)art->nodes + (ulong)(uint)(iVar3 * 8)) +
                            (uVar5 & 0xffffffffffff) *
                            *(long *)((long)ART_NODE_SIZES + (ulong)(uint)(iVar3 * 8)));
        }
        else {
          uVar6 = 0;
        }
      } while (uVar6 < uVar8);
    }
    if ((byte)(cVar4 - 1U) < 5) {
      uVar7 = (ulong)(((uint)ref & 0xff) << 3);
      *(ulong *)(*(long *)((long)art->nodes + uVar7) +
                *(long *)((long)ART_NODE_SIZES + uVar7) * uVar8) = uVar6;
    }
    if ((byte)(cVar4 - 1U) < 5 && uVar5 < uVar8) {
      *(ulong *)((long)art->nodes[uVar9] + (uVar5 & 0xffffffffffff) * __n) = uVar8;
    }
    ref = uVar1 << 0x10 | uVar9;
    if (uVar8 < uVar10) {
      uVar10 = uVar8;
    }
    art->first_free[uVar9] = uVar10;
  }
  return ref;
}

Assistant:

static art_ref_t art_move_node_to_shrink(art_t *art, art_ref_t ref) {
    uint64_t idx = art_ref_index(ref);
    art_typecode_t typecode = art_ref_typecode(ref);
    uint64_t first_free = art->first_free[typecode];
    assert(idx != first_free);
    if (idx < first_free) {
        return ref;
    }
    uint64_t from = idx;
    uint64_t to = first_free;
    uint64_t next_free = art_node_get_next_free(art, art_to_ref(to, typecode));
    memcpy(art_get_node(art, to, typecode), art_get_node(art, from, typecode),
           ART_NODE_SIZES[typecode]);

    // With an integer representing the next free index, and an `x` representing
    // an occupied index, assume the following scenario at the start of this
    // function:
    //     nodes = [1,2,5,x,x]
    //     first_free = 0
    //
    // We just moved a node from index 3 to 0:
    //     nodes = [x,2,5,?,x]
    //
    // We need to modify the free list so that the free indices are ascending.
    // This can be done by traversing the list until we find a node with a
    // `next_free` greater than the index we copied the node from, and inserting
    // the new index in between. This leads to the following:
    //     nodes = [x,2,3,5,x]
    //     first_free = 1
    uint64_t initial_next_free = next_free;
    uint64_t current = next_free;
    while (next_free < from) {
        current = next_free;
        next_free =
            art_node_get_next_free(art, art_to_ref(next_free, typecode));
    }
    art_node_set_next_free(art_deref(art, ref), typecode, next_free);
    if (current < from) {
        art_node_set_next_free(art_get_node(art, current, typecode), typecode,
                               from);
    }
    art->first_free[typecode] =
        from < initial_next_free ? from : initial_next_free;
    return art_to_ref(to, typecode);
}